

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *pcVar2;
  cmExternalMakefileProjectGenerator *pcVar3;
  _Alloc_hider _Var4;
  pointer puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  char cVar7;
  bool bVar8;
  long lVar9;
  string *psVar10;
  tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> this_00;
  long lVar11;
  ostream *poVar12;
  ulong uVar13;
  char cVar14;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  pointer puVar15;
  ulong __val;
  GlobalTargetInfo *globalTarget;
  undefined1 gti [8];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string __str;
  __single_object dirMfu;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  string local_218;
  long *local_1f8;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_1f0;
  long local_1e8 [2];
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> local_1d8;
  long local_1d0;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  long *local_1a8;
  string *local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined8 local_188;
  ios_base local_158 [272];
  cmStateSnapshot local_48;
  
  lVar9 = std::chrono::_V2::steady_clock::now();
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  pcVar2 = this->CMakeInstance;
  local_48.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_48.State = (pcVar2->CurrentSnapshot).State;
  local_48.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_1c8,&local_48);
  psVar10 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_1c8,psVar10);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_1c8,&local_48);
  psVar10 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_1c8,psVar10);
  this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)operator_new(0xdc0);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this,&local_48);
  local_1d8._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&this->Makefiles,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1d8);
  cmMakefile::SetRecursionDepth
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this->RecursionDepth);
  IndexMakefile(this,(cmMakefile *)
                     this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  psVar10 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar10);
  if (((this->ExtraGenerator)._M_t.
       super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl !=
       (cmExternalMakefileProjectGenerator *)0x0) &&
     (bVar8 = cmake::GetIsInTryCompile(this->CMakeInstance), !bVar8)) {
    pcVar2 = this->CMakeInstance;
    pcVar3 = (this->ExtraGenerator)._M_t.
             super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
    _Var4._M_p = (pcVar3->Name)._M_dataplus._M_p;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,_Var4._M_p,_Var4._M_p + (pcVar3->Name)._M_string_length);
    local_1c8 = (undefined1  [8])0x26;
    _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x81ecba;
    local_1b8._M_allocated_capacity = 0;
    local_1b8._8_8_ = local_1f0;
    local_1a8 = local_1f8;
    local_198 = 0x93;
    local_190 = 
    "\nis deprecated and will be removed from a future version of CMake.  IDEs may use the cmake-file-api(7) to view CMake-generated project build trees."
    ;
    local_188 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_1c8;
    local_1a0 = (string *)&local_1f8;
    cmCatViews(&local_218,views);
    local_1c8 = (undefined1  [8])0x0;
    _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1c8);
    cmake::IssueMessage(pcVar2,DEPRECATION_WARNING,&local_218,(cmListFileBacktrace *)local_1c8);
    if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
  }
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmMakefile::EnforceDirectoryLevelRules
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_1c8 = (undefined1  [8])0x0;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b8._M_allocated_capacity = 0;
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)local_1c8);
  puVar5 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar15 = (this->Makefiles).
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; _Var6._M_pi = _Stack_1c0._M_pi,
      gti = local_1c8, puVar15 != puVar5; puVar15 = puVar15 + 1) {
    for (; gti != (undefined1  [8])_Var6._M_pi; gti = (undefined1  [8])((long)gti + 0xa0)) {
      CreateGlobalTarget(this,(GlobalTargetInfo *)gti,
                         (puVar15->_M_t).
                         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    }
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)local_1c8);
  pcVar2 = this->CMakeInstance;
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CMAKE_NUMBER_OF_MAKEFILES","");
  __val = (long)(this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  cVar14 = '\x01';
  if (9 < __val) {
    uVar13 = __val;
    cVar7 = '\x04';
    do {
      cVar14 = cVar7;
      if (uVar13 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_004e0797;
      }
      if (uVar13 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_004e0797;
      }
      if (uVar13 < 10000) goto LAB_004e0797;
      bVar8 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar7 = cVar14 + '\x04';
    } while (bVar8);
    cVar14 = cVar14 + '\x01';
  }
LAB_004e0797:
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_218,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_218._M_dataplus._M_p,(uint)local_218._M_string_length,__val);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"number of local generators","");
  cmake::AddCacheEntry(pcVar2,(string *)local_1c8,&local_218,(string *)&local_1f8,4);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    if (((cmSystemTools::s_ErrorOccurred != false) || (cmSystemTools::s_FatalErrorOccurred != false)
        ) || (bVar8 = cmSystemTools::GetInterruptFlag(), bVar8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Configuring incomplete, errors occurred!",0x28);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Configuring done (",0x12);
      local_1d0 = (lVar11 - lVar9) / 1000000;
      *(uint *)((long)&local_1b8 + *(long *)((long)local_1c8 + -0x18) + 8) =
           *(uint *)((long)&local_1b8 + *(long *)((long)local_1c8 + -0x18) + 8) & 0xfffffefb | 4;
      *(undefined8 *)((long)&_Stack_1c0._M_pi + *(long *)((long)local_1c8 + -0x18)) = 1;
      poVar12 = std::ostream::_M_insert<long_double>((longdouble)local_1d0 / (longdouble)1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"s)",2);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,&local_218,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1d8);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  auto startTime = std::chrono::steady_clock::now();

  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  if (this->ExtraGenerator && !this->CMakeInstance->GetIsInTryCompile()) {
    this->CMakeInstance->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      cmStrCat("Support for \"Extra Generators\" like\n  ",
               this->ExtraGenerator->GetName(),
               "\nis deprecated and will be removed from a future version "
               "of CMake.  IDEs may use the cmake-file-api(7) to view "
               "CMake-generated project build trees."));
  }

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  this->GetCMakeInstance()->AddCacheEntry(
    "CMAKE_NUMBER_OF_MAKEFILES", std::to_string(this->Makefiles.size()),
    "number of local generators", cmStateEnums::INTERNAL);

  auto endTime = std::chrono::steady_clock::now();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
    } else {
      auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(
        endTime - startTime);
      msg << "Configuring done (" << std::fixed << std::setprecision(1)
          << ms.count() / 1000.0L << "s)";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}